

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetFloatVerifier::verifyBoolean4
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,bool reference0,bool reference1,
          bool reference2,bool reference3)

{
  float pname;
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  GLfloat local_230;
  GLfloat local_228;
  float local_220;
  float local_218;
  MessageBuilder local_1e8;
  float local_68;
  float local_64;
  GLfloat referenceAsGLfloat [4];
  undefined1 local_50 [8];
  StateQueryMemoryWriteGuard<float[4]> boolVector4;
  bool reference3_local;
  bool reference2_local;
  bool reference1_local;
  bool reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetFloatVerifier *this_local;
  
  boolVector4.m_postguard[2]._0_1_ = reference3;
  boolVector4.m_postguard[2]._1_1_ = reference2;
  boolVector4.m_postguard[2]._2_1_ = reference1;
  boolVector4.m_postguard[2]._3_1_ = reference0;
  boolVector4.m_postguard[3] = (float)name;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[4]> *)local_50);
  pname = boolVector4.m_postguard[3];
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_50);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,(GLenum)pname,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[4]> *)local_50,testCtx);
  if (bVar1) {
    local_218 = 1.0;
    if ((boolVector4.m_postguard[2]._3_1_ & 1) == 0) {
      local_218 = 0.0;
    }
    local_68 = local_218;
    local_220 = 1.0;
    if ((boolVector4.m_postguard[2]._2_1_ & 1) == 0) {
      local_220 = 0.0;
    }
    local_64 = local_220;
    local_228 = 1.0;
    if ((boolVector4.m_postguard[2]._1_1_ & 1) == 0) {
      local_228 = 0.0;
    }
    referenceAsGLfloat[0] = local_228;
    local_230 = 1.0;
    if ((boolVector4.m_postguard[2]._0_1_ & 1) == 0) {
      local_230 = 0.0;
    }
    referenceAsGLfloat[1] = local_230;
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
    if (((*pafVar3)[0] == local_68) && (!NAN((*pafVar3)[0]) && !NAN(local_68))) {
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
      if (((*pafVar3)[1] == local_64) && (!NAN((*pafVar3)[1]) && !NAN(local_64))) {
        pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
        if (((*pafVar3)[2] == referenceAsGLfloat[0]) &&
           (!NAN((*pafVar3)[2]) && !NAN(referenceAsGLfloat[0]))) {
          pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_50);
          if (((*pafVar3)[3] == referenceAsGLfloat[1]) &&
             (!NAN((*pafVar3)[3]) && !NAN(referenceAsGLfloat[1]))) {
            return;
          }
        }
      }
    }
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [20])"// ERROR: expected ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_68);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_64);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLfloat);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,referenceAsGLfloat + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
    }
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> boolVector4;
	glGetFloatv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLfloat referenceAsGLfloat[] =
	{
		reference0 ? 1.0f : 0.0f,
		reference1 ? 1.0f : 0.0f,
		reference2 ? 1.0f : 0.0f,
		reference3 ? 1.0f : 0.0f,
	};

	if (boolVector4[0] != referenceAsGLfloat[0] ||
		boolVector4[1] != referenceAsGLfloat[1] ||
		boolVector4[2] != referenceAsGLfloat[2] ||
		boolVector4[3] != referenceAsGLfloat[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLfloat[0] << " "
			<< referenceAsGLfloat[1] << " "
			<< referenceAsGLfloat[2] << " "
			<< referenceAsGLfloat[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}